

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,quint32 ip4Addr)

{
  QHostAddressPrivate *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  quint32 in_stack_ffffffffffffffdc;
  
  this_00 = (QHostAddressPrivate *)operator_new(0x38);
  QHostAddressPrivate::QHostAddressPrivate(this_00);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)this_00,
             (QHostAddressPrivate *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  setAddress((QHostAddress *)this_00,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

QHostAddress::QHostAddress(quint32 ip4Addr)
    : d(new QHostAddressPrivate)
{
    setAddress(ip4Addr);
}